

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

bool __thiscall Jupiter::IRC::Client::registerClient(Client *this)

{
  size_type sVar1;
  char *pcVar2;
  size_type sVar3;
  char *pcVar4;
  size_type sVar5;
  char *pcVar6;
  pointer pSVar7;
  ssize_t sVar8;
  ssize_t sVar9;
  int __flags;
  undefined8 uVar10;
  __sv_type _Var11;
  char *local_88;
  string local_80;
  __sv_type local_50;
  undefined1 local_40 [8];
  string message;
  char *localHostname;
  bool result;
  Client *this_local;
  
  message.field_2._8_8_ = Socket::getLocalHostname();
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&this->m_nickname);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (&this->m_nickname);
  uVar10 = message.field_2._8_8_;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&this->m_server_hostname);
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&this->m_server_hostname);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&this->m_realname);
  pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (&this->m_realname);
  string_printf_abi_cxx11_
            ((string *)local_40,"USER %.*s %s %.*s :%.*s\r\n",sVar1,pcVar2,uVar10,sVar3,pcVar4,sVar5
             ,pcVar6);
  __flags = (int)uVar10;
  pSVar7 = std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>::operator->
                     (&this->m_socket);
  local_50 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
  sVar8 = Socket::send(pSVar7,(int)local_50._M_len,local_50._M_str,(size_t)pcVar2,__flags);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&this->m_nickname);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (&this->m_nickname);
  string_printf_abi_cxx11_(&local_80,"NICK %.*s\r\n",sVar1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,&local_80
            );
  std::__cxx11::string::~string((string *)&local_80);
  pSVar7 = std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>::operator->
                     (&this->m_socket);
  _Var11 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
  local_88 = _Var11._M_str;
  sVar9 = Socket::send(pSVar7,(int)_Var11._M_len,local_88,(size_t)pcVar2,__flags);
  localHostname._7_1_ = 0 < (int)sVar9 && 0 < (int)sVar8;
  this->m_connection_status = 3;
  std::__cxx11::string::~string((string *)local_40);
  return localHostname._7_1_;
}

Assistant:

bool Jupiter::IRC::Client::registerClient() {
	bool result = true;
	const char *localHostname = Jupiter::Socket::getLocalHostname();
	std::string message = string_printf("USER %.*s %s %.*s :%.*s" ENDL, m_nickname.size(), m_nickname.data(), localHostname, m_server_hostname.size(), m_server_hostname.c_str(), m_realname.size(), m_realname.data());
	
	if (m_socket->send(message) <= 0)
		result = false;

	message = string_printf("NICK %.*s" ENDL, m_nickname.size(), m_nickname.data());

	if (m_socket->send(message) <= 0)
		result = false;

	m_connection_status = 3;
	return result;
}